

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O0

void Map_SuperTableSortSupergates(Map_HashTable_t *p,int nSupersMax)

{
  int iVar1;
  Map_Super_t **ppS1;
  int local_38;
  int local_34;
  int i;
  int nSupers;
  Map_Super_t *pSuper;
  Map_Super_t **ppSupers;
  Map_HashEntry_t *pEnt;
  int nSupersMax_local;
  Map_HashTable_t *p_local;
  
  ppS1 = (Map_Super_t **)malloc((long)nSupersMax << 3);
  local_34 = 0;
  for (local_38 = 0; local_38 < p->nBins; local_38 = local_38 + 1) {
    for (ppSupers = (Map_Super_t **)p->pBins[local_38]; ppSupers != (Map_Super_t **)0x0;
        ppSupers = (Map_Super_t **)ppSupers[3]) {
      for (_i = ppSupers[2]; _i != (Map_Super_t *)0x0; _i = _i->pNext) {
        ppS1[local_34] = _i;
        local_34 = local_34 + 1;
      }
    }
  }
  qsort(ppS1,(long)local_34,8,Map_SuperTableCompareSupergates);
  iVar1 = Map_SuperTableCompareSupergates(ppS1,ppS1 + (long)local_34 + -1);
  if (iVar1 < 1) {
    local_38 = 0;
    while ((local_38 < 10 && (ppS1[local_38]->nUsed != 0))) {
      printf("%5d : ",(ulong)(uint)ppS1[local_38]->nUsed);
      printf("%5d   ",(ulong)(uint)ppS1[local_38]->Num);
      printf("A = %5.2f   ",(double)ppS1[local_38]->Area);
      printf("D = %5.2f   ",(double)(ppS1[local_38]->tDelayMax).Rise);
      printf("%s",ppS1[local_38]->pFormula);
      printf("\n");
      local_38 = local_38 + 1;
    }
    if (ppS1 != (Map_Super_t **)0x0) {
      free(ppS1);
    }
    return;
  }
  __assert_fail("Map_SuperTableCompareSupergates( ppSupers, ppSupers + nSupers - 1 ) <= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTable.c"
                ,0x14d,"void Map_SuperTableSortSupergates(Map_HashTable_t *, int)");
}

Assistant:

void Map_SuperTableSortSupergates( Map_HashTable_t * p, int nSupersMax )
{
    Map_HashEntry_t * pEnt;
    Map_Super_t ** ppSupers;
    Map_Super_t * pSuper;
    int nSupers, i;

    // copy all the supergates into one array
    ppSupers = ABC_ALLOC( Map_Super_t *, nSupersMax );
    nSupers = 0;
    for ( i = 0; i < p->nBins; i++ )
        for ( pEnt = p->pBins[i]; pEnt; pEnt = pEnt->pNext )
            for ( pSuper = pEnt->pGates; pSuper; pSuper = pSuper->pNext )
                ppSupers[nSupers++] = pSuper;

    // sort by usage
    qsort( (void *)ppSupers, (size_t)nSupers, sizeof(Map_Super_t *), 
            (int (*)(const void *, const void *)) Map_SuperTableCompareSupergates );
    assert( Map_SuperTableCompareSupergates( ppSupers, ppSupers + nSupers - 1 ) <= 0 );

    // print out the "top ten"
//    for ( i = 0; i < nSupers; i++ )
    for ( i = 0; i < 10; i++ )
    {
        if ( ppSupers[i]->nUsed == 0 )
            break;
        printf( "%5d : ",        ppSupers[i]->nUsed );
        printf( "%5d   ",        ppSupers[i]->Num );
        printf( "A = %5.2f   ",  ppSupers[i]->Area );
        printf( "D = %5.2f   ",  ppSupers[i]->tDelayMax.Rise );
        printf( "%s",            ppSupers[i]->pFormula );
        printf( "\n" );
    }
    ABC_FREE( ppSupers );
}